

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O3

ZyanStatus
ZydisFormatterIntelPrintRegister
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisRegister reg)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  void *pvVar3;
  ZyanStatus ZVar4;
  ZydisShortString *source;
  ulong uVar5;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x138,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x139,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x13a,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  source = ZydisRegisterGetStringWrapped(reg);
  if (source == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar4 = ZydisStringAppendShortCase(&buffer->string,&STR_INVALID_REG,formatter->case_registers)
      ;
      if ((int)ZVar4 < 0) {
        return ZVar4;
      }
    }
    else {
      ZVar2 = (buffer->string).vector.size;
      if (0xfe < ZVar2 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      if (buffer->capacity <= ZVar2 + 10) {
        return 0x80100009;
      }
      pvVar3 = (buffer->string).vector.data;
      *(char *)((long)pvVar3 + -1) = (char)ZVar2;
      *(undefined8 *)((long)pvVar3 + ZVar2) = 0x696c61766e690007;
      *(undefined2 *)((long)pvVar3 + ZVar2 + 8) = 100;
      uVar5 = buffer->capacity - (ZVar2 + 2);
      buffer->capacity = uVar5;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
      (buffer->string).vector.size = 8;
      if (0xfe < uVar5) {
        uVar5 = 0xff;
      }
      (buffer->string).vector.capacity = uVar5;
    }
    return 0x100000;
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar4 = ZydisFormatterBufferAppend(buffer,'\a'), (int)ZVar4 < 0)) {
    return ZVar4;
  }
  ZVar4 = ZydisStringAppendShortCase(&buffer->string,source,formatter->case_registers);
  return ZVar4;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisRegister reg)
{
    ZYAN_UNUSED(context);

    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    const ZydisShortString* str = ZydisRegisterGetStringWrapped(reg);
    if (!str)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_REG, formatter->case_registers);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_REGISTER);
    return ZydisStringAppendShortCase(&buffer->string, str, formatter->case_registers);
}